

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examine_stack.cc
# Opt level: O0

void absl::debugging_internal::DumpPCAndFrameSizesAndStackTrace
               (void *pc,void **stack,int *frame_sizes,int depth,int min_dropped_frames,
               bool symbolize_stacktrace,OutputWriter *writer,void *writer_arg)

{
  char local_98 [8];
  char buf [100];
  int i;
  bool symbolize_stacktrace_local;
  int min_dropped_frames_local;
  int depth_local;
  int *frame_sizes_local;
  void **stack_local;
  void *pc_local;
  
  if (pc != (void *)0x0) {
    if (symbolize_stacktrace) {
      anon_unknown_0::DumpPCAndFrameSizeAndSymbol(writer,writer_arg,pc,pc,0,"PC: ");
    }
    else {
      anon_unknown_0::DumpPCAndFrameSize(writer,writer_arg,pc,0,"PC: ");
    }
  }
  buf[0x60] = '\0';
  buf[0x61] = '\0';
  buf[0x62] = '\0';
  buf[99] = '\0';
  for (; (int)buf._96_4_ < depth; buf._96_4_ = buf._96_4_ + 1) {
    if (symbolize_stacktrace) {
      anon_unknown_0::DumpPCAndFrameSizeAndSymbol
                (writer,writer_arg,stack[(int)buf._96_4_],
                 (void *)((long)stack[(int)buf._96_4_] + -1),frame_sizes[(int)buf._96_4_],"    ");
    }
    else {
      anon_unknown_0::DumpPCAndFrameSize
                (writer,writer_arg,stack[(int)buf._96_4_],frame_sizes[(int)buf._96_4_],"    ");
    }
  }
  if (0 < min_dropped_frames) {
    snprintf(local_98,100,"    @ ... and at least %d more frames\n",(ulong)(uint)min_dropped_frames)
    ;
    (*writer)(local_98,writer_arg);
  }
  return;
}

Assistant:

void DumpPCAndFrameSizesAndStackTrace(void* const pc, void* const stack[],
                                      int frame_sizes[], int depth,
                                      int min_dropped_frames,
                                      bool symbolize_stacktrace,
                                      OutputWriter* writer, void* writer_arg) {
  if (pc != nullptr) {
    // We don't know the stack frame size for PC, use 0.
    if (symbolize_stacktrace) {
      DumpPCAndFrameSizeAndSymbol(writer, writer_arg, pc, pc, 0, "PC: ");
    } else {
      DumpPCAndFrameSize(writer, writer_arg, pc, 0, "PC: ");
    }
  }
  for (int i = 0; i < depth; i++) {
    if (symbolize_stacktrace) {
      // Pass the previous address of pc as the symbol address because pc is a
      // return address, and an overrun may occur when the function ends with a
      // call to a function annotated noreturn (e.g. CHECK). Note that we don't
      // do this for pc above, as the adjustment is only correct for return
      // addresses.
      DumpPCAndFrameSizeAndSymbol(writer, writer_arg, stack[i],
                                  reinterpret_cast<char*>(stack[i]) - 1,
                                  frame_sizes[i], "    ");
    } else {
      DumpPCAndFrameSize(writer, writer_arg, stack[i], frame_sizes[i], "    ");
    }
  }
  if (min_dropped_frames > 0) {
    char buf[100];
    snprintf(buf, sizeof(buf), "    @ ... and at least %d more frames\n",
             min_dropped_frames);
    writer(buf, writer_arg);
  }
}